

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O1

Value __thiscall jbcoin::STPath::getJson(STPath *this,int param_1)

{
  uint32_t *puVar1;
  ValueHolder VVar2;
  ushort uVar3;
  uint uVar4;
  pointer pSVar5;
  Value *pVVar6;
  undefined4 extraout_var;
  ValueHolder *pVVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar8;
  long lVar9;
  _Rb_tree_header *p_Var10;
  undefined8 extraout_RDX;
  Currency *extraout_RDX_00;
  Currency *extraout_RDX_01;
  Currency *extraout_RDX_02;
  Currency *extraout_RDX_03;
  Currency *currency;
  undefined8 extraout_RDX_04;
  undefined8 uVar11;
  ushort uVar12;
  undefined4 in_register_00000034;
  undefined8 *puVar13;
  ushort uVar14;
  uint *puVar15;
  undefined1 in_R9B;
  undefined8 *puVar16;
  ulong uVar17;
  byte bVar18;
  Value VVar19;
  Value elem;
  STPathElement it;
  ValueHolder local_d8;
  ushort local_d0;
  ValueHolder local_c8;
  uint local_c0;
  ValueHolder local_b8 [2];
  ValueHolder local_a8;
  ValueHolder local_a0;
  uint local_98;
  undefined8 *local_90;
  ulong local_88;
  uint local_80;
  undefined1 local_7c [20];
  jbcoin local_68 [20];
  undefined1 local_54 [36];
  
  bVar18 = 0;
  *(ushort *)
   &(this->mPath).super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
    _M_impl.super__Vector_impl_data._M_finish =
       (ushort)*(undefined4 *)
                &(this->mPath).
                 super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
                 _M_impl.super__Vector_impl_data._M_finish & 0xfe00 | 6;
  pSVar5 = (pointer)operator_new(0x30);
  puVar1 = (pSVar5->mAccountID).pn + 1;
  (pSVar5->mAccountID).pn[3] = 0;
  (pSVar5->mAccountID).pn[4] = 0;
  (pSVar5->mCurrencyID).pn[0] = 0;
  (pSVar5->mCurrencyID).pn[1] = 0;
  (pSVar5->mCurrencyID).pn[2] = 0;
  (pSVar5->mCurrencyID).pn[3] = 0;
  *(undefined8 *)((pSVar5->mCurrencyID).pn + 4) = 0;
  pSVar5->mType = 0;
  (pSVar5->mAccountID).pn[0] = 0;
  (pSVar5->mAccountID).pn[1] = 0;
  (pSVar5->mAccountID).pn[2] = 0;
  *(uint32_t **)(pSVar5->mCurrencyID).pn = puVar1;
  *(uint32_t **)((pSVar5->mCurrencyID).pn + 2) = puVar1;
  *(undefined8 *)((pSVar5->mCurrencyID).pn + 4) = 0;
  (this->mPath).super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
  _M_impl.super__Vector_impl_data._M_start = pSVar5;
  puVar16 = *(undefined8 **)CONCAT44(in_register_00000034,param_1);
  local_90 = (undefined8 *)((undefined8 *)CONCAT44(in_register_00000034,param_1))[1];
  uVar11 = extraout_RDX;
  local_a8 = (ValueHolder)this;
  if (puVar16 != local_90) {
    do {
      puVar13 = puVar16;
      puVar15 = &local_80;
      for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined8 *)puVar15 = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        puVar15 = puVar15 + ((ulong)bVar18 * -2 + 1) * 2;
      }
      local_98 = local_98 & 0xfffffe00 | 7;
      local_a0.string_ = (char *)operator_new(0x30);
      uVar4 = local_80;
      uVar8 = local_c0;
      p_Var10 = &((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(char *)((long)local_a0 + 0) = '\0';
      *(char *)((long)local_a0 + 1) = '\0';
      *(char *)((long)local_a0 + 2) = '\0';
      *(char *)((long)local_a0 + 3) = '\0';
      *(char *)((long)local_a0 + 4) = '\0';
      *(char *)((long)local_a0 + 5) = '\0';
      *(char *)((long)local_a0 + 6) = '\0';
      *(char *)((long)local_a0 + 7) = '\0';
      *(undefined8 *)&((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var10->_M_header;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var10->_M_header
      ;
      ((local_a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      uVar17 = (ulong)(int)local_80;
      uVar12 = (ushort)local_c0;
      local_c0 = CONCAT31(local_c0._1_3_,1);
      local_c8.uint_ = local_80;
      pVVar6 = Json::Value::resolveReference((Value *)&local_a0,"type",true);
      VVar2 = (ValueHolder)(pVVar6->value_).real_;
      pVVar6->value_ = local_c8;
      uVar3 = *(ushort *)&pVVar6->field_0x8;
      uVar14 = (uVar3 & 0xff00) + 1;
      *(ushort *)&pVVar6->field_0x8 = uVar14;
      *(ushort *)&pVVar6->field_0x8 = uVar14 & 0xfe01 | uVar12 & 0x100;
      uVar8 = uVar8 & 0xfe00 | (uint)(byte)uVar3 | uVar3 & 0x100;
      local_c0 = CONCAT22((short)(local_c0 >> 0x10),(short)uVar8);
      local_c8 = VVar2;
      Json::Value::~Value((Value *)&local_c8);
      local_88 = uVar17 >> 0x38 | (uVar17 & 0xff000000000000) >> 0x28 |
                 (uVar17 & 0xff0000000000) >> 0x18 | (uVar17 & 0xff00000000) >> 8 |
                 (uVar17 & 0xff000000) << 8 | (uVar17 & 0xff0000) << 0x18 |
                 (uVar17 & 0xff00) << 0x28 | uVar17 << 0x38;
      strHex<unsigned_char*>((string *)&local_c8,(jbcoin *)&local_88,(uchar *)0x8,uVar8);
      uVar12 = local_d0 & 0xfe00;
      local_d0 = uVar12 + 0x104;
      Json::valueAllocator();
      local_d8._0_4_ =
           (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                     (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0);
      local_d8._4_4_ = extraout_var;
      pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"type_hex",true)->value_;
      VVar2 = *pVVar7;
      *pVVar7 = local_d8;
      uVar3 = *(ushort *)(pVVar7 + 1);
      pVVar7[1].bool_ = true;
      *(ushort *)(pVVar7 + 1) = uVar3 & 0xff04 | 0x104;
      local_d0 = uVar3 & 0x100 | uVar12 | uVar3 & 0xff;
      local_d8 = VVar2;
      Json::Value::~Value((Value *)&local_d8);
      currency = extraout_RDX_00;
      if (local_c8 != local_b8) {
        operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        currency = extraout_RDX_01;
      }
      if ((uVar17 & 1) != 0) {
        encodeToken_abi_cxx11_
                  ((string *)&local_c8,(jbcoin *)0x0,(uint8_t)local_7c,(void *)0x14,0,(bool)in_R9B);
        uVar12 = local_d0 & 0xfe00;
        local_d0 = uVar12 + 0x104;
        Json::valueAllocator();
        local_d8._0_4_ =
             (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                       (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0);
        local_d8._4_4_ = extraout_var_00;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"account",true)->value_;
        VVar2 = *pVVar7;
        *pVVar7 = local_d8;
        uVar3 = *(ushort *)(pVVar7 + 1);
        pVVar7[1].bool_ = true;
        *(ushort *)(pVVar7 + 1) = uVar3 & 0xff04 | 0x104;
        local_d0 = uVar3 & 0x100 | uVar12 | uVar3 & 0xff;
        local_d8 = VVar2;
        Json::Value::~Value((Value *)&local_d8);
        currency = extraout_RDX_02;
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
          currency = extraout_RDX_03;
        }
      }
      if ((uVar4 & 0x10) != 0) {
        to_string_abi_cxx11_((string *)&local_c8,local_68,currency);
        uVar12 = local_d0 & 0xfe00;
        local_d0 = uVar12 + 0x104;
        Json::valueAllocator();
        local_d8._0_4_ =
             (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                       (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0);
        local_d8._4_4_ = extraout_var_01;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"currency",true)->value_;
        VVar2 = *pVVar7;
        *pVVar7 = local_d8;
        uVar3 = *(ushort *)(pVVar7 + 1);
        pVVar7[1].bool_ = true;
        *(ushort *)(pVVar7 + 1) = uVar3 & 0xff04 | 0x104;
        local_d0 = uVar3 & 0x100 | uVar12 | uVar3 & 0xff;
        local_d8 = VVar2;
        Json::Value::~Value((Value *)&local_d8);
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        }
      }
      if ((uVar4 & 0x20) != 0) {
        encodeToken_abi_cxx11_
                  ((string *)&local_c8,(jbcoin *)0x0,(uint8_t)local_54,(void *)0x14,0,(bool)in_R9B);
        uVar12 = local_d0 & 0xfe00;
        local_d0 = uVar12 + 0x104;
        Json::valueAllocator();
        local_d8._0_4_ =
             (*Json::valueAllocator::valueAllocator->_vptr_ValueAllocator[4])
                       (Json::valueAllocator::valueAllocator,local_c8.real_,(ulong)local_c0);
        local_d8._4_4_ = extraout_var_02;
        pVVar7 = &Json::Value::resolveReference((Value *)&local_a0,"issuer",true)->value_;
        VVar2 = *pVVar7;
        *pVVar7 = local_d8;
        uVar3 = *(ushort *)(pVVar7 + 1);
        pVVar7[1].bool_ = true;
        *(ushort *)(pVVar7 + 1) = uVar3 & 0xff04 | 0x104;
        local_d0 = uVar3 & 0x100 | uVar12 | uVar3 & 0xff;
        local_d8 = VVar2;
        Json::Value::~Value((Value *)&local_d8);
        if (local_c8 != local_b8) {
          operator_delete(local_c8.string_,(ulong)(local_b8[0].string_ + 1));
        }
      }
      Json::Value::append((Value *)local_a8.map_,(Value *)&local_a0);
      Json::Value::~Value((Value *)&local_a0);
      puVar16 = puVar16 + 10;
      uVar11 = extraout_RDX_04;
    } while (puVar16 != local_90);
  }
  VVar19._8_8_ = uVar11;
  VVar19.value_.real_ = local_a8.real_;
  return VVar19;
}

Assistant:

Json::Value
STPath::getJson (int) const
{
    Json::Value ret (Json::arrayValue);

    for (auto it: mPath)
    {
        Json::Value elem (Json::objectValue);
        int         iType   = it.getNodeType ();

        elem[jss::type]      = iType;
        elem[jss::type_hex]  = strHex (iType);

        if (iType & STPathElement::typeAccount)
            elem[jss::account]  = to_string (it.getAccountID ());

        if (iType & STPathElement::typeCurrency)
            elem[jss::currency] = to_string (it.getCurrency ());

        if (iType & STPathElement::typeIssuer)
            elem[jss::issuer]   = to_string (it.getIssuerID ());

        ret.append (elem);
    }

    return ret;
}